

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::SubstrateMaterial::writeTo(SubstrateMaterial *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  int32_t local_6c;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->kd);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_28,&(this->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_6c = BinaryWriter::serialize(binary,(SP *)local_28);
  BinaryWriter::write<int>(binary,&local_6c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->ks);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_38,&(this->map_ks).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_6c = BinaryWriter::serialize(binary,(SP *)local_38);
  BinaryWriter::write<int>(binary,&local_6c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_48,&(this->map_bump).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_6c = BinaryWriter::serialize(binary,(SP *)local_48);
  BinaryWriter::write<int>(binary,&local_6c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  BinaryWriter::write<float>(binary,&this->uRoughness);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_58,&(this->map_uRoughness).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_6c = BinaryWriter::serialize(binary,(SP *)local_58);
  BinaryWriter::write<int>(binary,&local_6c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  BinaryWriter::write<float>(binary,&this->vRoughness);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_68,&(this->map_vRoughness).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_6c = BinaryWriter::serialize(binary,(SP *)local_68);
  BinaryWriter::write<int>(binary,&local_6c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  BinaryWriter::write<bool>(binary,&this->remapRoughness);
  return 0x11;
}

Assistant:

int SubstrateMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(kd);
    binary.write(binary.serialize(map_kd));
    binary.write(ks);
    binary.write(binary.serialize(map_ks));
    binary.write(binary.serialize(map_bump));
    binary.write(uRoughness);
    binary.write(binary.serialize(map_uRoughness));
    binary.write(vRoughness);
    binary.write(binary.serialize(map_vRoughness));
    binary.write(remapRoughness);
    return TYPE_SUBSTRATE_MATERIAL;
  }